

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O2

void __thiscall spvtools::opt::Instruction::SetResultId(Instruction *this,uint32_t res_id)

{
  bool bVar1;
  initializer_list<unsigned_int> init_list;
  uint32_t local_44;
  SmallVector<unsigned_int,_2UL> local_40;
  
  if (this->has_result_id_ == false) {
    __assert_fail("has_result_id_",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                  ,0x2c8,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
  }
  if (res_id != 0) {
    bVar1 = this->has_type_id_;
    init_list._M_len = 1;
    init_list._M_array = &local_44;
    local_44 = res_id;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_40,init_list);
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&(this->operands_).
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_start[bVar1].words,&local_40);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_40);
    return;
  }
  __assert_fail("res_id != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                ,0x2cd,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
}

Assistant:

inline void Instruction::SetResultId(uint32_t res_id) {
  // TODO(dsinclair): Allow setting a result id if there wasn't one
  // previously. Need to make room in the operands_ array to place the result,
  // and update the has_result_id_ flag.
  assert(has_result_id_);

  // TODO(dsinclair): Allow removing the result id. This needs to make sure,
  // if there was a result id previously to remove it from the operands_ array
  // and reset the has_result_id_ flag.
  assert(res_id != 0);

  auto ridx = has_type_id_ ? 1 : 0;
  operands_[ridx].words = {res_id};
}